

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzD::ArchiveOUT(ChNodeFEAxyzD *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChNodeFEAxyzD *)
             ((long)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase +
             (long)(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[-0x17]),in_RSI
            );
  return;
}

Assistant:

void ChNodeFEAxyzD::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAxyzD>();
    // serialize parent class
    ChNodeFEAxyz::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(D);
    marchive << CHNVP(D_dt);
    marchive << CHNVP(D_dtdt);
}